

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_pooling.c
# Opt level: O1

rt_function_error_t exec_max_pooling(rt_function_t *f)

{
  byte bVar1;
  pooling_context_t *context;
  pooling_private_t *p;
  byte bVar2;
  rt_function_error_t rVar3;
  
  context = (pooling_context_t *)f->local_context;
  p = (pooling_private_t *)context->data;
  bVar1 = ((p->calc_context).x)->field_0x10;
  bVar2 = bVar1 & 0xf;
  if (bVar2 == 2) {
LAB_00118730:
    if ((((p->calc_context).y)->field_0x10 & 0xf) == 2) {
      rVar3 = exec_pooling_fixed8(f,context,p,calc_max_fixed8);
      return rVar3;
    }
    if (bVar2 != 1) goto LAB_0011876e;
  }
  else if (bVar2 != 1) {
    if ((bVar1 & 0xf) != 0) goto LAB_0011876e;
    if ((((p->calc_context).y)->field_0x10 & 0xf) == 0) {
      rVar3 = exec_pooling(f,context,p,calc_max);
      return rVar3;
    }
    if (bVar2 != 1) {
      if (bVar2 != 2) goto LAB_0011876e;
      goto LAB_00118730;
    }
  }
  if ((((p->calc_context).y)->field_0x10 & 0xf) == 1) {
    rVar3 = exec_pooling_fixed16(f,context,p,calc_max_fixed16);
    return rVar3;
  }
LAB_0011876e:
  rVar3 = exec_pooling_generic(f,context,p,calc_max_generic);
  return rVar3;
}

Assistant:

rt_function_error_t exec_max_pooling(rt_function_t *f) {
  max_pooling_local_context_t *context =
      (max_pooling_local_context_t *)(f->local_context);
  pooling_private_t *p =
      (pooling_private_t *)(((max_pooling_local_context_t *)(f->local_context))
                                ->data);
  if (p->calc_context.x->type == NN_DATA_TYPE_FLOAT &&
      p->calc_context.y->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_MAXPOOLING_FLOAT32
    return exec_pooling(f, (pooling_context_t *)context, p, calc_max);
#endif /* CONFIG_MAXPOOLING_FLOAT32 */
  }

  else if (p->calc_context.x->type == NN_DATA_TYPE_INT8 &&
           p->calc_context.y->type == NN_DATA_TYPE_INT8) {
#ifdef CONFIG_MAXPOOLING_FIXED8
    return exec_pooling_fixed8(f, (pooling_context_t *)context, p,
                               calc_max_fixed8);
#endif /* CONFIG_MAXPOOLING_FIXED8 */
  }

  else if (p->calc_context.x->type == NN_DATA_TYPE_INT16 &&
           p->calc_context.y->type == NN_DATA_TYPE_INT16) {
#ifdef CONFIG_MAXPOOLING_FIXED16
    return exec_pooling_fixed16(f, (pooling_context_t *)context, p,
                                calc_max_fixed16);
#endif /* CONFIG_MAXPOOLING_FIXED16 */
  }

  else {
#ifdef CONFIG_MAXPOOLING_GENERIC
    return exec_pooling_generic(f, (pooling_context_t *)context, p,
                                calc_max_generic);
#endif /* CONFIG_MAXPOOLING_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}